

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool get_filesize(char *name,size_t *size)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  _Bool _Var3;
  
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    _Var3 = false;
  }
  else {
    _Var3 = false;
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      sVar2 = ftell(__stream);
      *size = sVar2;
      _Var3 = false;
      iVar1 = fseek(__stream,0,0);
      if (iVar1 == 0) {
        fclose(__stream);
        _Var3 = true;
      }
    }
  }
  return _Var3;
}

Assistant:

bool get_filesize(const char *name, size_t *size)
{
	FILE *fp = fopen(name, "rb");
	if (!fp)
	{
		return false;
	}
	if (fseek(fp, 0, SEEK_END) != 0)
	{
		return false;
	}
	*size = ftell(fp);
	if (size < 0)
	{
		return false;
	}
	if (fseek(fp, 0, SEEK_SET) != 0)
	{
		return false;
	}
	fclose(fp);
	return true;
}